

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_state_ptr lzham::lzham_lib_decompress_init(lzham_decompress_params *pParams)

{
  bool bVar1;
  uint32 uVar2;
  size_t *pActual_size;
  uint8 *puVar3;
  uchar *puVar4;
  lzham_decompress_params *in_RDI;
  uint32 decomp_buf_size;
  lzham_decompressor *pState;
  lzham_malloc_context malloc_context;
  undefined4 in_stack_ffffffffffffffd8;
  void **in_stack_ffffffffffffffe0;
  lzham_decompress_params *size;
  lzham_malloc_context in_stack_fffffffffffffff8;
  lzham_decompressor *this;
  
  bVar1 = check_params(in_RDI);
  if (bVar1) {
    pActual_size = (size_t *)
                   lzham_create_malloc_context((uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    this = lzham_new<lzham::lzham_decompressor,void*>(pActual_size,in_stack_ffffffffffffffe0);
    if (this == (lzham_decompressor *)0x0) {
      lzham_destroy_malloc_context((lzham_malloc_context)0x0);
      this = (lzham_decompressor *)0x0;
    }
    else {
      size = in_RDI;
      memcpy(&this->m_params,in_RDI,0x28);
      if (((this->m_params).m_decompress_flags & 1) == 0) {
        uVar2 = 1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f);
        puVar3 = (uint8 *)lzham_malloc(in_stack_fffffffffffffff8,(size_t)size,pActual_size);
        this->m_pRaw_decomp_buf = puVar3;
        if (this->m_pRaw_decomp_buf == (uint8 *)0x0) {
          lzham_delete<lzham::lzham_decompressor>
                    (this,(lzham_decompressor *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
          lzham_destroy_malloc_context(this);
          return (lzham_decompress_state_ptr)0x0;
        }
        this->m_raw_decomp_buf_size = uVar2;
        in_RDI = (lzham_decompress_params *)0x10;
        puVar4 = math::align_up_pointer<unsigned_char*>(this->m_pRaw_decomp_buf,0x10);
        this->m_pDecomp_buf = puVar4;
      }
      else {
        this->m_pRaw_decomp_buf = (uint8 *)0x0;
        this->m_raw_decomp_buf_size = 0;
        this->m_pDecomp_buf = (uint8 *)0x0;
      }
      lzham_decompressor::init(this,(EVP_PKEY_CTX *)in_RDI);
    }
  }
  else {
    this = (lzham_decompressor *)0x0;
  }
  return this;
}

Assistant:

lzham_decompress_state_ptr LZHAM_CDECL lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if (!check_params(pParams))
         return NULL;

      lzham_malloc_context malloc_context = lzham_create_malloc_context(LZHAM_DECOMP_MEMORY_ARENA_SIZE);
      
      lzham_decompressor *pState = lzham_new<lzham_decompressor>(malloc_context, malloc_context);
      if (!pState)
      {
         lzham_destroy_malloc_context(malloc_context);
         return NULL;
      }
      
      pState->m_params = *pParams;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_raw_decomp_buf_size = 0;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         uint32 decomp_buf_size = 1U << pState->m_params.m_dict_size_log2;
         pState->m_pRaw_decomp_buf = static_cast<uint8*>(lzham_malloc(malloc_context, decomp_buf_size + 15));
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(malloc_context, pState);
            lzham_destroy_malloc_context(malloc_context);
            return NULL;
         }
         pState->m_raw_decomp_buf_size = decomp_buf_size;
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();
      
      return pState;
   }